

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__ref_attachment
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ref_attachment__AttributeData *prVar2;
  StringHash SVar3;
  long *in_RSI;
  ParserTemplateBase *in_RDI;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  ref_attachment__AttributeData *attributeData;
  URI *in_stack_fffffffffffffda8;
  URI *in_stack_fffffffffffffdb0;
  URI *this_00;
  void **in_stack_fffffffffffffdb8;
  StringHash in_stack_fffffffffffffdc8;
  bool *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  StringHash in_stack_fffffffffffffea8;
  ErrorType in_stack_fffffffffffffeb0;
  Severity in_stack_fffffffffffffeb4;
  ParserTemplateBase *in_stack_fffffffffffffeb8;
  byte local_51;
  undefined8 *local_38;
  bool local_1;
  
  prVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::ref_attachment__AttributeData>(in_RDI,in_stack_fffffffffffffdb8)
  ;
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_00875196:
    if ((prVar2->present_attributes & 1) == 0) {
      this_00 = (URI *)&stack0xfffffffffffffdc8;
      COLLADABU::URI::URI((URI *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
      COLLADABU::URI::operator=(this_00,in_stack_fffffffffffffda8);
      COLLADABU::URI::~URI(this_00);
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*local_38 == (ParserChar *)0x0) goto LAB_00875196;
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*local_38);
        if (local_38 == (undefined8 *)0xfffffffffffffff8) {
          return false;
        }
        local_38 = local_38 + 2;
        if (SVar3 != 0xfa21a69) break;
        GeneratedSaxParser::Utils::toURI
                  ((ParserChar **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0);
        COLLADABU::URI::operator=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        COLLADABU::URI::~URI(in_stack_fffffffffffffdb0);
        if (((local_51 & 1) != 0) &&
           (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)in_stack_fffffffffffffde0,
                               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
                               (StringHash)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (ParserChar *)in_RDI), bVar1)) {
          return false;
        }
        if ((local_51 & 1) == 0) {
          prVar2->present_attributes = prVar2->present_attributes | 1;
        }
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (ParserChar *)in_stack_fffffffffffffea0,
                         (ParserChar *)in_stack_fffffffffffffe98);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__ref_attachment( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__ref_attachment( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

ref_attachment__AttributeData* attributeData = newData<ref_attachment__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_rigid_body:
    {
bool failed;
attributeData->rigid_body = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_REF_ATTACHMENT,
        HASH_ATTRIBUTE_rigid_body,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= ref_attachment__AttributeData::ATTRIBUTE_RIGID_BODY_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_REF_ATTACHMENT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & ref_attachment__AttributeData::ATTRIBUTE_RIGID_BODY_PRESENT) == 0)
{
    attributeData->rigid_body = COLLADABU::URI("");
}


    return true;
}